

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O0

FieldGeneratorInfo * __thiscall
google::protobuf::compiler::java::Context::GetFieldGeneratorInfo
          (Context *this,FieldDescriptor *field)

{
  LogMessage *pLVar1;
  string *value;
  LogFinisher local_65 [13];
  LogMessage local_58;
  second_type *local_20;
  FieldGeneratorInfo *result;
  FieldDescriptor *field_local;
  Context *this_local;
  
  result = (FieldGeneratorInfo *)field;
  field_local = (FieldDescriptor *)this;
  local_20 = FindOrNull<std::map<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::FieldGeneratorInfo,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::compiler::java::FieldGeneratorInfo>>>>
                       (&this->field_generator_info_map_,(first_type *)&result);
  if (local_20 == (second_type *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_context.cc"
               ,0xaf);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_58,"Can not find FieldGeneratorInfo for field: ");
    value = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)result);
    pLVar1 = internal::LogMessage::operator<<(pLVar1,value);
    internal::LogFinisher::operator=(local_65,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
  }
  return local_20;
}

Assistant:

const FieldGeneratorInfo* Context::GetFieldGeneratorInfo(
    const FieldDescriptor* field) const {
  const FieldGeneratorInfo* result =
      FindOrNull(field_generator_info_map_, field);
  if (result == NULL) {
    GOOGLE_LOG(FATAL) << "Can not find FieldGeneratorInfo for field: "
               << field->full_name();
  }
  return result;
}